

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O0

void Hop_ObjCleanData_rec(Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *pObj_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopUtil.c"
                  ,0x5a,"void Hop_ObjCleanData_rec(Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsPo(pObj);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pHVar2 = Hop_ObjFanin0(pObj);
      Hop_ObjCleanData_rec(pHVar2);
      pHVar2 = Hop_ObjFanin1(pObj);
      Hop_ObjCleanData_rec(pHVar2);
    }
    (pObj->field_0).pData = (void *)0x0;
    return;
  }
  __assert_fail("!Hop_ObjIsPo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopUtil.c"
                ,0x5b,"void Hop_ObjCleanData_rec(Hop_Obj_t *)");
}

Assistant:

void Hop_ObjCleanData_rec( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsPo(pObj) );
    if ( Hop_ObjIsAnd(pObj) )
    {
        Hop_ObjCleanData_rec( Hop_ObjFanin0(pObj) );
        Hop_ObjCleanData_rec( Hop_ObjFanin1(pObj) );
    }
    pObj->pData = NULL;
}